

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringTest.cpp
# Opt level: O3

void __thiscall
TEST_SimpleString_copyInBufferWithSmallerBufferThanNeeded_Test::testBody
          (TEST_SimpleString_copyInBufferWithSmallerBufferThanNeeded_Test *this)

{
  char cVar1;
  size_t bufferSize;
  char *bufferToCopy;
  UtestShell *pUVar2;
  char *pcVar3;
  TestTerminator *pTVar4;
  SimpleString str;
  
  SimpleString::SimpleString(&str,"Hello");
  bufferSize = SimpleString::size(&str);
  bufferToCopy = (char *)(*PlatformSpecificMalloc)(bufferSize);
  SimpleString::copyToBuffer(&str,bufferToCopy,bufferSize);
  pUVar2 = UtestShell::getCurrent();
  pcVar3 = SimpleString::asCharString(&str);
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[10])
            (pUVar2,pcVar3,bufferToCopy,bufferSize - 1,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
             ,0x23d,pTVar4);
  pUVar2 = UtestShell::getCurrent();
  cVar1 = bufferToCopy[bufferSize - 1];
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[0xe])
            (pUVar2,0,(long)cVar1,"LONGS_EQUAL(0, buffer[bufferSize-1]) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
             ,0x23e,pTVar4);
  (*PlatformSpecificFree)(bufferToCopy);
  SimpleString::~SimpleString(&str);
  return;
}

Assistant:

TEST(SimpleString, copyInBufferWithSmallerBufferThanNeeded)
{
    SimpleString str("Hello");
    size_t bufferSize = str.size();
    char* buffer= (char*) PlatformSpecificMalloc(bufferSize);
    str.copyToBuffer(buffer, bufferSize);
    STRNCMP_EQUAL(str.asCharString(), buffer, (bufferSize-1));
    LONGS_EQUAL(0, buffer[bufferSize-1]);
    PlatformSpecificFree(buffer);
}